

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

char * curl_pushheader_byname(curl_pushheaders *h,char *header)

{
  HTTP *pHVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  ulong local_38;
  size_t i;
  size_t len;
  HTTP *stream;
  char *header_local;
  curl_pushheaders *h_local;
  
  if (((((h != (curl_pushheaders *)0x0) && (h->data != (Curl_easy *)0x0)) &&
       (h->data->magic == 0xc0dedbad)) && ((header != (char *)0x0 && (*header != '\0')))) &&
     ((iVar2 = strcmp(header,":"), iVar2 != 0 &&
      (pcVar3 = strchr(header + 1,0x3a), pcVar3 == (char *)0x0)))) {
    pHVar1 = (h->data->req).p.http;
    __n = strlen(header);
    for (local_38 = 0; local_38 < pHVar1->push_headers_used; local_38 = local_38 + 1) {
      iVar2 = strncmp(header,pHVar1->push_headers[local_38],__n);
      if ((iVar2 == 0) && (pHVar1->push_headers[local_38][__n] == ':')) {
        return pHVar1->push_headers[local_38] + __n + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_pushheader_byname(struct curl_pushheaders *h, const char *header)
{
  /* Verify that we got a good easy handle in the push header struct,
     mostly to detect rubbish input fast(er). Also empty header name
     is just a rubbish too. We have to allow ":" at the beginning of
     the header, but header == ":" must be rejected. If we have ':' in
     the middle of header, it could be matched in middle of the value,
     this is because we do prefix match.*/
  if(!h || !GOOD_EASY_HANDLE(h->data) || !header || !header[0] ||
     !strcmp(header, ":") || strchr(header + 1, ':'))
    return NULL;
  else {
    struct HTTP *stream = h->data->req.p.http;
    size_t len = strlen(header);
    size_t i;
    for(i = 0; i<stream->push_headers_used; i++) {
      if(!strncmp(header, stream->push_headers[i], len)) {
        /* sub-match, make sure that it is followed by a colon */
        if(stream->push_headers[i][len] != ':')
          continue;
        return &stream->push_headers[i][len + 1];
      }
    }
  }
  return NULL;
}